

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall glcts::AdvancedUsageDrawUpdateDraw::Setup(AdvancedUsageDrawUpdateDraw *this)

{
  this->prog2_ = 0;
  this->fbo_ = 0;
  this->rt_[0] = 0;
  this->rt_[1] = 0;
  this->counter_buffer_ = 0;
  this->vao_ = 0;
  this->vbo_ = 0;
  this->prog_ = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		counter_buffer_ = 0;
		vao_ = vbo_ = 0;
		prog_		= 0;
		prog2_		= 0;
		fbo_ = rt_[0] = rt_[1] = 0;
		return NO_ERROR;
	}